

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O2

void __thiscall
FFontChar2::FFontChar2
          (FFontChar2 *this,int sourcelump,int sourcepos,int width,int height,int leftofs,int topofs
          )

{
  FTexture::FTexture(&this->super_FTexture,(char *)0x0,-1);
  (this->super_FTexture)._vptr_FTexture = (_func_int **)&PTR__FFontChar2_006f9330;
  *(int *)&(this->super_FTexture).field_0x54 = sourcelump;
  this->SourcePos = sourcepos;
  this->Pixels = (BYTE *)0x0;
  this->Spans = (Span **)0x0;
  this->SourceRemap = (BYTE *)0x0;
  (this->super_FTexture).UseType = '\t';
  (this->super_FTexture).Width = (WORD)width;
  (this->super_FTexture).Height = (WORD)height;
  (this->super_FTexture).LeftOffset = (SWORD)leftofs;
  (this->super_FTexture).TopOffset = (SWORD)topofs;
  FTexture::CalcBitSize(&this->super_FTexture);
  return;
}

Assistant:

FFontChar2::FFontChar2 (int sourcelump, int sourcepos, int width, int height, int leftofs, int topofs)
: SourceLump (sourcelump), SourcePos (sourcepos), Pixels (0), Spans (0), SourceRemap(NULL)
{
	UseType = TEX_FontChar;
	Width = width;
	Height = height;
	LeftOffset = leftofs;
	TopOffset = topofs;
	CalcBitSize ();
}